

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O1

void __thiscall
TPZSkylMatrix<std::complex<float>_>::SolveSOR
          (TPZSkylMatrix<std::complex<float>_> *this,int64_t *numiterations,
          TPZFMatrix<std::complex<float>_> *F,TPZFMatrix<std::complex<float>_> *result,
          TPZFMatrix<std::complex<float>_> *residual,TPZFMatrix<std::complex<float>_> *scratch,
          REAL overrelax,REAL *tol,int FromCurrent,int direction)

{
  long lVar1;
  undefined8 uVar2;
  _ComplexT _Var3;
  long lVar4;
  complex<float> **ppcVar5;
  complex<float> *pcVar6;
  long lVar7;
  int iVar8;
  undefined4 extraout_var;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  complex<float> *pcVar14;
  undefined8 *puVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  complex<float> *pcVar19;
  long lVar20;
  float __x;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined8 uVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  double local_120;
  long local_a8;
  
  if (residual == F) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZMatrix::SolveSOR called with residual and F equal, no solution\n",0x42);
    return;
  }
  if (residual == (TPZFMatrix<std::complex<float>_> *)0x0) {
    local_120 = *tol + *tol + 1.0;
  }
  else {
    Dot<std::complex<float>>(residual,residual);
    if (__x < 0.0) {
      fVar21 = sqrtf(__x);
    }
    else {
      fVar21 = SQRT(__x);
    }
    local_120 = (double)fVar21;
  }
  if (FromCurrent == 0) {
    (*(result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xf])(result);
  }
  iVar8 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  lVar11 = CONCAT44(extraout_var,iVar8) + -1;
  lVar16 = 0;
  lVar7 = lVar16;
  if (direction != -1) {
    lVar11 = lVar16;
    lVar7 = CONCAT44(extraout_var,iVar8);
  }
  if ((0 < *numiterations) && (*tol <= local_120 && local_120 != *tol)) {
    fVar21 = (float)overrelax;
    lVar4 = (F->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
    lVar1 = (ulong)(direction != -1) * 2 + -1;
    lVar16 = 0;
    do {
      TPZFMatrix<std::complex<float>_>::operator=(scratch,F);
      local_120 = 0.0;
      if (0 < lVar4) {
        local_120 = 0.0;
        local_a8 = 0;
        lVar18 = 0;
        do {
          lVar13 = lVar11;
          lVar10 = lVar11 * 8 + 8;
          if (direction == 1) {
            for (; lVar12 = lVar11, lVar13 != lVar7; lVar13 = lVar13 + lVar1) {
              ppcVar5 = (this->fElem).fStore;
              pcVar6 = ppcVar5[lVar13];
              lVar17 = (long)ppcVar5[lVar13 + 1] - (long)pcVar6;
              lVar12 = lVar17 >> 3;
              if (((lVar13 - lVar12 < -1) ||
                  ((scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <=
                   (lVar13 - lVar12) + 1)) ||
                 ((scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
                  lVar18)) {
                TPZFMatrix<std::complex<float>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              pcVar19 = scratch->fElem;
              if (((lVar13 < 0) ||
                  ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <=
                   lVar13)) ||
                 ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar18
                 )) {
                TPZFMatrix<std::complex<float>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              puVar15 = (undefined8 *)((long)(this->fElem).fStore[lVar13] + lVar17 + -8);
              lVar17 = (long)puVar15 - (long)pcVar6 >> 3;
              if (-1 < lVar17) {
                lVar9 = (result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow *
                        lVar18;
                fVar28 = *(float *)&result->fElem[lVar9 + lVar13]._M_value;
                fVar29 = *(float *)((long)&result->fElem[lVar9 + lVar13]._M_value + 4);
                lVar20 = (scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow *
                         local_a8 + lVar10;
                lVar9 = 0;
                do {
                  fVar22 = (float)*puVar15;
                  fVar23 = (float)((ulong)*puVar15 >> 0x20);
                  fVar27 = fVar28 * fVar22 - fVar29 * fVar23;
                  fVar26 = fVar28 * fVar23 + fVar29 * fVar22;
                  uVar24 = CONCAT44(fVar26,fVar27);
                  if ((NAN(fVar27)) && (uVar24 = CONCAT44(fVar26,fVar27), NAN(fVar26))) {
                    uVar24 = __mulsc3(fVar22,fVar23);
                  }
                  uVar2 = *(undefined8 *)((long)&pcVar19[lVar9 - lVar12]._M_value + lVar20);
                  *(ulong *)((long)&pcVar19[lVar9 - lVar12]._M_value + lVar20) =
                       CONCAT44((float)((ulong)uVar2 >> 0x20) - (float)((ulong)uVar24 >> 0x20),
                                (float)uVar2 - (float)uVar24);
                  lVar9 = lVar9 + 1;
                  puVar15 = puVar15 + -1;
                } while (lVar17 + 1 != lVar9);
              }
              lVar10 = lVar10 + lVar1 * 8;
            }
            for (; lVar12 != lVar7; lVar12 = lVar12 + lVar1) {
              ppcVar5 = (this->fElem).fStore;
              lVar13 = (long)ppcVar5[lVar12 + 1] - (long)ppcVar5[lVar12];
              if (((lVar12 < 0) ||
                  ((scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <=
                   lVar12)) ||
                 ((scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
                  lVar18)) {
                TPZFMatrix<std::complex<float>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar10 = lVar13 >> 3;
              _Var3 = scratch->fElem
                      [(scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow *
                       lVar18 + lVar12]._M_value;
              fVar28 = (float)_Var3;
              fVar29 = (float)(_Var3 >> 0x20);
              lVar17 = (lVar12 - lVar10) + 1;
              if (((lVar12 - lVar10 < -1) ||
                  ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <=
                   lVar17)) ||
                 ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar18
                 )) {
                TPZFMatrix<std::complex<float>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              pcVar6 = (this->fElem).fStore[lVar12];
              pcVar19 = (complex<float> *)((long)pcVar6 + lVar13 + -8);
              if (pcVar6 < pcVar19) {
                pcVar14 = result->fElem +
                          (result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow *
                          lVar18 + lVar17;
                do {
                  fVar22 = (float)pcVar19->_M_value;
                  fVar23 = (float)(pcVar19->_M_value >> 0x20);
                  _Var3 = pcVar14->_M_value;
                  fVar27 = (float)(_Var3 >> 0x20);
                  fVar26 = (float)_Var3 * fVar22 - fVar27 * fVar23;
                  fVar25 = fVar22 * fVar27 + fVar23 * (float)_Var3;
                  uVar24 = CONCAT44(fVar25,fVar26);
                  if ((NAN(fVar26)) && (uVar24 = CONCAT44(fVar25,fVar26), NAN(fVar25))) {
                    uVar24 = __mulsc3(fVar22,fVar23,_Var3,fVar27);
                  }
                  fVar28 = fVar28 - (float)uVar24;
                  fVar29 = fVar29 - (float)((ulong)uVar24 >> 0x20);
                  pcVar14 = pcVar14 + 1;
                  pcVar19 = pcVar19 + -1;
                } while (pcVar6 < pcVar19);
              }
              fVar22 = fVar28 * fVar28 - fVar29 * fVar29;
              if ((NAN(fVar22)) && (NAN(fVar28 * fVar29 + fVar29 * fVar28))) {
                fVar22 = (float)__mulsc3();
              }
              fVar22 = cabsf(fVar22);
              fVar23 = fVar28 * fVar21 - fVar29 * 0.0;
              fVar26 = fVar29 * fVar21 + fVar28 * 0.0;
              uVar24 = CONCAT44(fVar26,fVar23);
              if ((NAN(fVar23)) && (uVar24 = CONCAT44(fVar26,fVar23), NAN(fVar26))) {
                uVar24 = __mulsc3(fVar28,fVar29);
              }
              uVar24 = __divsc3((int)uVar24,(int)((ulong)uVar24 >> 0x20));
              if (((lVar12 < 0) ||
                  ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <=
                   lVar12)) ||
                 ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar18
                 )) {
                TPZFMatrix<std::complex<float>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              local_120 = local_120 + (double)fVar22;
              lVar13 = (result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow *
                       lVar18;
              _Var3 = result->fElem[lVar13 + lVar12]._M_value;
              result->fElem[lVar13 + lVar12]._M_value =
                   CONCAT44((float)((ulong)uVar24 >> 0x20) + (float)(_Var3 >> 0x20),
                            (float)uVar24 + (float)_Var3);
            }
          }
          else {
            for (; lVar10 = lVar11, lVar13 != lVar7; lVar13 = lVar13 + lVar1) {
              ppcVar5 = (this->fElem).fStore;
              lVar10 = (long)ppcVar5[lVar13 + 1] - (long)ppcVar5[lVar13];
              if (((lVar13 < 0) ||
                  ((scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <=
                   lVar13)) ||
                 ((scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
                  lVar18)) {
                TPZFMatrix<std::complex<float>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar12 = lVar10 >> 3;
              _Var3 = scratch->fElem
                      [(scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow *
                       lVar18 + lVar13]._M_value;
              fVar28 = (float)_Var3;
              fVar29 = (float)(_Var3 >> 0x20);
              lVar17 = (lVar13 - lVar12) + 1;
              if (((lVar13 - lVar12 < -1) ||
                  ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <=
                   lVar17)) ||
                 ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar18
                 )) {
                TPZFMatrix<std::complex<float>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              pcVar6 = (this->fElem).fStore[lVar13];
              pcVar19 = (complex<float> *)((long)pcVar6 + lVar10 + -8);
              if (pcVar6 < pcVar19) {
                pcVar14 = result->fElem +
                          (result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow *
                          lVar18 + lVar17;
                do {
                  fVar23 = (float)pcVar19->_M_value;
                  fVar26 = (float)(pcVar19->_M_value >> 0x20);
                  fVar22 = *(float *)((long)&pcVar14->_M_value + 4);
                  fVar27 = *(float *)&pcVar14->_M_value * fVar23 - fVar26 * fVar22;
                  fVar22 = *(float *)&pcVar14->_M_value * fVar26 + fVar23 * fVar22;
                  uVar24 = CONCAT44(fVar22,fVar27);
                  if ((NAN(fVar27)) && (uVar24 = CONCAT44(fVar22,fVar27), NAN(fVar22))) {
                    uVar24 = __mulsc3(fVar23,fVar26);
                  }
                  fVar28 = fVar28 - (float)uVar24;
                  fVar29 = fVar29 - (float)((ulong)uVar24 >> 0x20);
                  pcVar19 = pcVar19 + -1;
                  pcVar14 = pcVar14 + 1;
                } while (pcVar6 < pcVar19);
              }
              if (((lVar13 < 0) ||
                  ((scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <=
                   lVar13)) ||
                 ((scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
                  lVar18)) {
                TPZFMatrix<std::complex<float>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              scratch->fElem
              [(scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * lVar18 +
               lVar13]._M_value = CONCAT44(fVar29,fVar28);
            }
            for (; lVar10 != lVar7; lVar10 = lVar10 + lVar1) {
              ppcVar5 = (this->fElem).fStore;
              pcVar6 = ppcVar5[lVar10];
              lVar17 = (long)ppcVar5[lVar10 + 1] - (long)pcVar6;
              lVar13 = lVar17 >> 3;
              lVar12 = (lVar10 - lVar13) + 1;
              if (((lVar10 - lVar13 < -1) ||
                  ((scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <=
                   lVar12)) ||
                 ((scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
                  lVar18)) {
                TPZFMatrix<std::complex<float>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar13 = (scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
              pcVar19 = scratch->fElem;
              if (((lVar10 < 0) || (lVar13 <= lVar10)) ||
                 ((scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <=
                  lVar18)) {
                TPZFMatrix<std::complex<float>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              _Var3 = scratch->fElem
                      [(scratch->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow *
                       lVar18 + lVar10]._M_value;
              if (((lVar10 < 0) ||
                  ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <=
                   lVar10)) ||
                 ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar18
                 )) {
                TPZFMatrix<std::complex<float>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar9 = (result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow *
                      lVar18;
              fVar22 = (float)pcVar6->_M_value;
              fVar23 = (float)(pcVar6->_M_value >> 0x20);
              fVar28 = *(float *)&result->fElem[lVar9 + lVar10]._M_value;
              fVar29 = *(float *)((long)&result->fElem[lVar9 + lVar10]._M_value + 4);
              fVar26 = fVar28 * fVar22 - fVar23 * fVar29;
              fVar28 = fVar28 * fVar23 + fVar22 * fVar29;
              uVar24 = CONCAT44(fVar28,fVar26);
              if ((NAN(fVar26)) && (uVar24 = CONCAT44(fVar28,fVar26), NAN(fVar28))) {
                uVar24 = __mulsc3(fVar22,fVar23);
              }
              fVar29 = (float)_Var3 - (float)uVar24;
              fVar22 = (float)(_Var3 >> 0x20) - (float)((ulong)uVar24 >> 0x20);
              fVar28 = fVar29 * fVar29 - fVar22 * fVar22;
              if ((NAN(fVar28)) && (NAN(fVar22 * fVar29 + fVar22 * fVar29))) {
                fVar28 = (float)__mulsc3();
              }
              fVar28 = cabsf(fVar28);
              fVar23 = fVar29 * fVar21 - fVar22 * 0.0;
              fVar29 = fVar22 * fVar21 + fVar29 * 0.0;
              uVar24 = CONCAT44(fVar29,fVar23);
              if ((NAN(fVar23)) && (uVar24 = CONCAT44(fVar29,fVar23), NAN(fVar29))) {
                uVar24 = __mulsc3(fVar21,0);
              }
              uVar24 = __divsc3((int)uVar24,(int)((ulong)uVar24 >> 0x20));
              if (((lVar10 < 0) ||
                  ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <=
                   lVar10)) ||
                 ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar18
                 )) {
                TPZFMatrix<std::complex<float>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              lVar9 = (result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow *
                      lVar18;
              _Var3 = result->fElem[lVar9 + lVar10]._M_value;
              result->fElem[lVar9 + lVar10]._M_value =
                   CONCAT44((float)((ulong)uVar24 >> 0x20) + (float)(_Var3 >> 0x20),
                            (float)uVar24 + (float)_Var3);
              if (((lVar10 < 0) ||
                  ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <=
                   lVar10)) ||
                 ((result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar18
                 )) {
                TPZFMatrix<std::complex<float>_>::Error
                          ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              pcVar14 = (complex<float> *)((long)(this->fElem).fStore[lVar10] + lVar17 + -8);
              if (pcVar6 < pcVar14) {
                pcVar19 = pcVar19 + lVar13 * lVar18 + lVar12;
                _Var3 = result->fElem
                        [(result->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow *
                         lVar18 + lVar10]._M_value;
                fVar29 = (float)_Var3;
                fVar22 = (float)(_Var3 >> 0x20);
                do {
                  fVar23 = (float)pcVar14->_M_value;
                  fVar26 = (float)(pcVar14->_M_value >> 0x20);
                  fVar25 = fVar29 * fVar23 - fVar22 * fVar26;
                  fVar27 = fVar29 * fVar26 + fVar22 * fVar23;
                  uVar24 = CONCAT44(fVar27,fVar25);
                  if ((NAN(fVar25)) && (uVar24 = CONCAT44(fVar27,fVar25), NAN(fVar27))) {
                    uVar24 = __mulsc3(fVar23,fVar26);
                  }
                  pcVar19->_M_value =
                       CONCAT44((float)(pcVar19->_M_value >> 0x20) - (float)((ulong)uVar24 >> 0x20),
                                (float)pcVar19->_M_value - (float)uVar24);
                  pcVar19 = pcVar19 + 1;
                  pcVar14 = pcVar14 + -1;
                } while (pcVar6 < pcVar14);
              }
              local_120 = local_120 + (double)fVar28;
            }
          }
          lVar18 = lVar18 + 1;
          local_a8 = local_a8 + 8;
        } while (lVar18 != lVar4);
      }
      if (local_120 < 0.0) {
        local_120 = sqrt(local_120);
      }
      else {
        local_120 = SQRT(local_120);
      }
      lVar16 = lVar16 + 1;
    } while ((lVar16 < *numiterations) && (*tol <= local_120 && local_120 != *tol));
  }
  if (residual != (TPZFMatrix<std::complex<float>_> *)0x0) {
    (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x28])(this,result,F);
  }
  *numiterations = lVar16;
  *tol = local_120;
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::SolveSOR(int64_t & numiterations,const TPZFMatrix<TVar> &F,
                                   TPZFMatrix<TVar> &result, TPZFMatrix<TVar> *residual, TPZFMatrix<TVar> &scratch,const REAL overrelax,
                                   REAL &tol,const int FromCurrent,const int direction)  {
	
	if(residual == &F) {
		cout << "TPZMatrix::SolveSOR called with residual and F equal, no solution\n";
		return;
	}
	REAL res = 2.*tol+1.;
	if(residual) res = Norm(*residual);
	if(!FromCurrent) {
		result.Zero();
	}
    TVar over = overrelax;
	int64_t r = this->Dim();
	int64_t c = F.Cols();
	int64_t i,ifirst = 0, ilast = r, iinc = 1;
	if(direction == -1) {
		ifirst = r-1;
		ilast = 0;
		iinc = -1;
	}
	int64_t it;
	for(it=0; it<numiterations && res > tol; it++) {
		res = 0.;
		scratch = F;
		for(int64_t ic=0; ic<c; ic++) {
			if(direction == 1) {
				//
				// compute the upper triangular part first and put into the scractch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val;
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					int64_t lastid = diag-diaglast;
					int64_t id;
					for(id=0; id<=lastid; id++) *(scratchp+id) -= *(diag-id) * val;
					/* codeguard fix
					 while( diag >= diaglast ) *scratchp++ -= *diag-- * val;
					 */
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					res += abs(val*val);
					result(i,ic) += val*over/ (*diag);
				}
			} else {
				//
				// the direction is upward
				//
				// put the lower triangular part of the multiplication into the scratch vector
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					TVar val = scratch(i,ic);
					TVar *p = &result(i-offset+1,ic);
					TVar *diag = fElem[i] + offset-1;
					TVar *diaglast = fElem[i];
					while( diag > diaglast ) val -= *diag-- * *p++;
					//					res += val*val;
					scratch(i,ic) = val;
				}
				//
				// perform the SOR operation
				//
				for(i=ifirst; i!=ilast; i+= iinc) {
					//TPZColuna *mydiag = &fDiag[i];
					int64_t offset = Size(i);
					//	TVar val = scratch(i,ic);
					TVar *diag;
					TVar *diaglast = fElem[i];
					TVar *scratchp = &scratch(i-offset+1,ic);
					//val= result(i,ic);
					TVar val = scratch(i,ic);
					val -= *diaglast * result(i,ic);
					res += abs(val*val);
					val = over * val / *diaglast;
					result(i,ic) += val;
					val = result(i,ic);
					diag = fElem[i] + offset-1;
					while( diag > diaglast ) *scratchp++ -= *diag-- * val;
				}
			}
		}
		res = sqrt(res);
	}
	if(residual) {
		this->Residual(result,F,*residual);
	}
	numiterations = it;
	tol = res;
}